

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O3

void __thiscall dynet::AdagradTrainer::alloc_impl(AdagradTrainer *this)

{
  pointer pSVar1;
  vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_> local_48;
  vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_> local_28;
  
  allocate_shadow_parameters
            ((vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *)&local_48,
             (this->super_Trainer).model);
  pSVar1 = (this->vp).
           super__Vector_base<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->vp).super__Vector_base<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)local_48.
                super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this->vp).super__Vector_base<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_48.
                super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->vp).super__Vector_base<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_48.
                super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1);
    if (local_48.
        super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  allocate_shadow_lookup_parameters(&local_28,(this->super_Trainer).model);
  local_48.
  super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->vlp).
       super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->vlp).
  super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_28.
       super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this->vlp).
       super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (this->vlp).
       super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->vlp).
  super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_28.
       super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->vlp).
  super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_28.
       super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>::
  ~vector(&local_48);
  std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>::
  ~vector(&local_28);
  return;
}

Assistant:

void AdagradTrainer::alloc_impl() {
  vp = allocate_shadow_parameters(*model);
  vlp = allocate_shadow_lookup_parameters(*model);
}